

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_scan_avx2_256_16.c
# Opt level: O3

parasail_result_t *
parasail_sw_stats_scan_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  void *pvVar4;
  void *pvVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  __m256i c_02;
  __m256i c_03;
  __m256i c_04;
  __m256i c_05;
  uint uVar22;
  undefined4 uVar23;
  ulong uVar24;
  parasail_result_t *ppVar25;
  __m256i *b;
  __m256i *b_00;
  __m256i *b_01;
  __m256i *b_02;
  __m256i *b_03;
  __m256i *b_04;
  __m256i *b_05;
  __m256i *b_06;
  __m256i *__dest;
  __m256i *__dest_00;
  __m256i *__dest_01;
  __m256i *__dest_02;
  __m256i *ptr;
  __m256i *ptr_00;
  size_t __n;
  short sVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  short sVar30;
  int iVar31;
  uint uVar32;
  short sVar34;
  uint uVar35;
  uint uVar36;
  long lVar37;
  uint uVar38;
  uint uVar39;
  ulong uVar40;
  short sVar41;
  undefined2 uVar42;
  undefined2 uVar43;
  undefined2 uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar46 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar54 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 in_stack_fffffffffffffcc8 [12];
  ushort uVar60;
  undefined2 uVar61;
  __m256i *ptr_01;
  __m256i *ptr_02;
  int local_2fc;
  undefined1 local_2a8 [32];
  undefined1 local_288 [32];
  undefined1 local_138 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_58 [32];
  ulong uVar33;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_stats_scan_profile_avx2_256_16_cold_8();
  }
  else {
    pvVar2 = (profile->profile16).score;
    if (pvVar2 == (void *)0x0) {
      parasail_sw_stats_scan_profile_avx2_256_16_cold_7();
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        parasail_sw_stats_scan_profile_avx2_256_16_cold_6();
      }
      else {
        uVar38 = profile->s1Len;
        uVar24 = (ulong)uVar38;
        if ((int)uVar38 < 1) {
          parasail_sw_stats_scan_profile_avx2_256_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_stats_scan_profile_avx2_256_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_stats_scan_profile_avx2_256_16_cold_3();
        }
        else if (open < 0) {
          parasail_sw_stats_scan_profile_avx2_256_16_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_stats_scan_profile_avx2_256_16_cold_1();
        }
        else {
          pvVar4 = (profile->profile16).matches;
          iVar27 = ppVar3->min;
          iVar31 = -iVar27;
          if (iVar27 != -open && SBORROW4(iVar27,-open) == iVar27 + open < 0) {
            iVar31 = open;
          }
          uVar44 = (undefined2)iVar31;
          uVar61 = (undefined2)((uint)iVar31 >> 0x10);
          pvVar5 = (profile->profile16).similar;
          sVar41 = 0x7ffe - (short)ppVar3->max;
          ppVar25 = parasail_result_new_stats();
          if (ppVar25 != (parasail_result_t *)0x0) {
            uVar40 = uVar24 + 0xf >> 4;
            ppVar25->flag = ppVar25->flag | 0x10210404;
            b = parasail_memalign___m256i(0x20,uVar40);
            b_00 = parasail_memalign___m256i(0x20,uVar40);
            b_01 = parasail_memalign___m256i(0x20,uVar40);
            b_02 = parasail_memalign___m256i(0x20,uVar40);
            b_03 = parasail_memalign___m256i(0x20,uVar40);
            b_04 = parasail_memalign___m256i(0x20,uVar40);
            b_05 = parasail_memalign___m256i(0x20,uVar40);
            b_06 = parasail_memalign___m256i(0x20,uVar40);
            __dest = parasail_memalign___m256i(0x20,uVar40);
            __dest_00 = parasail_memalign___m256i(0x20,uVar40);
            __dest_01 = parasail_memalign___m256i(0x20,uVar40);
            __dest_02 = parasail_memalign___m256i(0x20,uVar40);
            ptr = parasail_memalign___m256i(0x20,uVar40);
            ptr_00 = parasail_memalign___m256i(0x20,uVar40);
            auVar49._8_8_ = 0;
            auVar49._0_8_ = b;
            auVar54._8_8_ = 0;
            auVar54._0_8_ = b_00;
            auVar49 = vpunpcklqdq_avx(auVar49,auVar54);
            auVar45._8_8_ = 0;
            auVar45._0_8_ = b_01;
            auVar47._8_8_ = 0;
            auVar47._0_8_ = b_02;
            auVar54 = vpunpcklqdq_avx(auVar45,auVar47);
            auVar45 = ZEXT116(0) * auVar54 + ZEXT116(1) * auVar49;
            auVar47 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar54;
            auVar48._8_8_ = 0;
            auVar48._0_8_ = b_03;
            auVar55._8_8_ = 0;
            auVar55._0_8_ = b_04;
            auVar49 = vpunpcklqdq_avx(auVar48,auVar55);
            auVar56._8_8_ = 0;
            auVar56._0_8_ = b_05;
            auVar57._8_8_ = 0;
            auVar57._0_8_ = b_06;
            auVar54 = vpunpcklqdq_avx(auVar56,auVar57);
            auVar49 = ZEXT116(0) * auVar54 + ZEXT116(1) * auVar49;
            auVar54 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar54;
            auVar46._0_8_ = -(ulong)(auVar45._0_8_ == 0);
            auVar46._8_8_ = -(ulong)(auVar45._8_8_ == 0);
            auVar46._16_8_ = -(ulong)(auVar47._0_8_ == 0);
            auVar46._24_8_ = -(ulong)(auVar47._8_8_ == 0);
            auVar50._0_8_ = -(ulong)(auVar49._0_8_ == 0);
            auVar50._8_8_ = -(ulong)(auVar49._8_8_ == 0);
            auVar50._16_8_ = -(ulong)(auVar54._0_8_ == 0);
            auVar50._24_8_ = -(ulong)(auVar54._8_8_ == 0);
            auVar46 = vpackssdw_avx2(auVar46,auVar50);
            if ((((((((auVar46 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar46 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar46 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar46 >> 0x7f,0) != '\0') ||
                  (auVar46 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar46 >> 0xbf,0) != '\0') ||
                (auVar46 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar46[0x1f] < '\0') {
              return (parasail_result_t *)0x0;
            }
            if (__dest == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (__dest_00 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (__dest_01 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (__dest_02 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_00 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            uVar42 = (undefined2)open;
            uVar43 = (undefined2)gap;
            uVar35 = CONCAT22(uVar61,uVar44) - 0x7fff;
            uVar44 = (undefined2)uVar35;
            uVar39 = (uint)uVar40;
            local_288._0_2_ = (undefined2)uVar40;
            local_288._2_2_ = local_288._0_2_;
            local_288._4_2_ = local_288._0_2_;
            local_288._6_2_ = local_288._0_2_;
            local_288._8_2_ = local_288._0_2_;
            local_288._10_2_ = local_288._0_2_;
            local_288._12_2_ = local_288._0_2_;
            local_288._14_2_ = local_288._0_2_;
            local_288._16_2_ = local_288._0_2_;
            local_288._18_2_ = local_288._0_2_;
            local_288._20_2_ = local_288._0_2_;
            local_288._22_2_ = local_288._0_2_;
            local_288._24_2_ = local_288._0_2_;
            local_288._26_2_ = local_288._0_2_;
            local_288._28_2_ = local_288._0_2_;
            local_288._30_2_ = local_288._0_2_;
            auVar20 = vperm2i128_avx2(local_288,local_288,0x28);
            uVar36 = uVar35 & 0xffff;
            auVar52._0_2_ = (undefined2)-(gap * uVar39);
            auVar52._2_2_ = auVar52._0_2_;
            auVar52._4_2_ = auVar52._0_2_;
            auVar52._6_2_ = auVar52._0_2_;
            auVar52._8_2_ = auVar52._0_2_;
            auVar52._10_2_ = auVar52._0_2_;
            auVar52._12_2_ = auVar52._0_2_;
            auVar52._14_2_ = auVar52._0_2_;
            auVar52._16_2_ = auVar52._0_2_;
            auVar52._18_2_ = auVar52._0_2_;
            auVar52._20_2_ = auVar52._0_2_;
            auVar52._22_2_ = auVar52._0_2_;
            auVar52._24_2_ = auVar52._0_2_;
            auVar52._26_2_ = auVar52._0_2_;
            auVar52._28_2_ = auVar52._0_2_;
            auVar52._30_2_ = auVar52._0_2_;
            auVar46 = vpand_avx2(auVar52,_DAT_00908de0);
            auVar46 = vpaddsw_avx2(ZEXT432(uVar36),auVar46);
            alVar1[1]._4_2_ = uVar44;
            alVar1._0_12_ = in_stack_fffffffffffffcc8;
            alVar1[1]._6_2_ = (short)(uVar35 >> 0x10);
            alVar1[2] = (longlong)b_01;
            alVar1[3] = (longlong)b_00;
            parasail_memset___m256i(b_03,alVar1,uVar40);
            c[1]._4_2_ = (short)uVar35;
            c._0_12_ = in_stack_fffffffffffffcc8;
            c[1]._6_2_ = (short)(uVar35 >> 0x10);
            c[2] = (longlong)b_01;
            c[3] = (longlong)b_00;
            parasail_memset___m256i(b_04,c,uVar40);
            c_00[1]._4_2_ = (short)uVar35;
            c_00._0_12_ = in_stack_fffffffffffffcc8;
            c_00[1]._6_2_ = (short)(uVar35 >> 0x10);
            c_00[2] = (longlong)b_01;
            c_00[3] = (longlong)b_00;
            parasail_memset___m256i(b_05,c_00,uVar40);
            c_01[1]._4_2_ = (short)uVar35;
            c_01._0_12_ = in_stack_fffffffffffffcc8;
            c_01[1]._6_2_ = (short)(uVar35 >> 0x10);
            c_01[2] = (longlong)b_01;
            c_01[3] = (longlong)b_00;
            parasail_memset___m256i(b_06,c_01,uVar40);
            c_02[1]._4_2_ = (short)uVar35;
            c_02._0_12_ = in_stack_fffffffffffffcc8;
            c_02[1]._6_2_ = (short)(uVar35 >> 0x10);
            c_02[2] = (longlong)b_01;
            c_02[3] = (longlong)b_00;
            parasail_memset___m256i(b,c_02,uVar40);
            c_03[1]._4_2_ = (short)uVar35;
            c_03._0_12_ = in_stack_fffffffffffffcc8;
            c_03[1]._6_2_ = (short)(uVar35 >> 0x10);
            c_03[2] = (longlong)b_01;
            c_03[3] = (longlong)b_00;
            parasail_memset___m256i(b_00,c_03,uVar40);
            c_04[1]._4_2_ = (short)uVar35;
            c_04._0_12_ = in_stack_fffffffffffffcc8;
            c_04[1]._6_2_ = (short)(uVar35 >> 0x10);
            c_04[2] = (longlong)b_01;
            c_04[3] = (longlong)b_00;
            parasail_memset___m256i(b_01,c_04,uVar40);
            c_05[1]._4_2_ = (short)uVar35;
            c_05._0_12_ = in_stack_fffffffffffffcc8;
            c_05[1]._6_2_ = (short)(uVar35 >> 0x10);
            c_05[2] = (longlong)b_01;
            c_05[3] = (longlong)b_00;
            parasail_memset___m256i(b_02,c_05,uVar40);
            auVar21._2_2_ = uVar43;
            auVar21._0_2_ = uVar43;
            auVar21._4_2_ = uVar43;
            auVar21._6_2_ = uVar43;
            auVar21._8_2_ = uVar43;
            auVar21._10_2_ = uVar43;
            auVar21._12_2_ = uVar43;
            auVar21._14_2_ = uVar43;
            auVar21._16_2_ = uVar43;
            auVar21._18_2_ = uVar43;
            auVar21._20_2_ = uVar43;
            auVar21._22_2_ = uVar43;
            auVar21._24_2_ = uVar43;
            auVar21._26_2_ = uVar43;
            auVar21._28_2_ = uVar43;
            auVar21._30_2_ = uVar43;
            auVar18._2_2_ = uVar42;
            auVar18._0_2_ = uVar42;
            auVar18._4_2_ = uVar42;
            auVar18._6_2_ = uVar42;
            auVar18._8_2_ = uVar42;
            auVar18._10_2_ = uVar42;
            auVar18._12_2_ = uVar42;
            auVar18._14_2_ = uVar42;
            auVar18._16_2_ = uVar42;
            auVar18._18_2_ = uVar42;
            auVar18._20_2_ = uVar42;
            auVar18._22_2_ = uVar42;
            auVar18._24_2_ = uVar42;
            auVar18._26_2_ = uVar42;
            auVar18._28_2_ = uVar42;
            auVar18._30_2_ = uVar42;
            uVar22 = uVar39 - 1;
            auVar18 = vpsubsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar18);
            lVar28 = (ulong)uVar22 << 5;
            auVar51._8_2_ = 1;
            auVar51._0_8_ = 0x1000100010001;
            auVar51._10_2_ = 1;
            auVar51._12_2_ = 1;
            auVar51._14_2_ = 1;
            auVar51._16_2_ = 1;
            auVar51._18_2_ = 1;
            auVar51._20_2_ = 1;
            auVar51._22_2_ = 1;
            auVar51._24_2_ = 1;
            auVar51._26_2_ = 1;
            auVar51._28_2_ = 1;
            auVar51._30_2_ = 1;
            uVar33 = uVar40;
            auVar50 = auVar51;
            do {
              *(undefined1 (*) [32])((long)*ptr + lVar28) = auVar18;
              *(undefined1 (*) [32])((long)*ptr_00 + lVar28) = auVar50;
              auVar18 = vpsubsw_avx2(auVar18,auVar21);
              auVar50 = vpaddsw_avx2(auVar50,auVar51);
              lVar28 = lVar28 + -0x20;
              iVar27 = (int)uVar33;
              uVar32 = iVar27 - 1;
              uVar33 = (ulong)uVar32;
            } while (uVar32 != 0 && 0 < iVar27);
            auVar50 = vpalignr_avx2(local_288,auVar20,0xe);
            __n = uVar40 << 5;
            lVar28 = (ulong)(uVar39 + (uVar39 == 0)) << 5;
            uVar40 = 0;
            local_2fc = 0;
            local_f8._2_2_ = uVar44;
            local_f8._0_2_ = uVar44;
            local_f8._4_2_ = uVar44;
            local_f8._6_2_ = uVar44;
            local_f8._8_2_ = uVar44;
            local_f8._10_2_ = uVar44;
            local_f8._12_2_ = uVar44;
            local_f8._14_2_ = uVar44;
            local_f8._16_2_ = uVar44;
            local_f8._18_2_ = uVar44;
            local_f8._20_2_ = uVar44;
            local_f8._22_2_ = uVar44;
            local_f8._24_2_ = uVar44;
            local_f8._26_2_ = uVar44;
            local_f8._28_2_ = uVar44;
            local_f8._30_2_ = uVar44;
            auVar17._2_2_ = sVar41;
            auVar17._0_2_ = sVar41;
            auVar17._4_2_ = sVar41;
            auVar17._6_2_ = sVar41;
            auVar17._8_2_ = sVar41;
            auVar17._10_2_ = sVar41;
            auVar17._12_2_ = sVar41;
            auVar17._14_2_ = sVar41;
            auVar17._16_2_ = sVar41;
            auVar17._18_2_ = sVar41;
            auVar17._20_2_ = sVar41;
            auVar17._22_2_ = sVar41;
            auVar17._24_2_ = sVar41;
            auVar17._26_2_ = sVar41;
            auVar17._28_2_ = sVar41;
            auVar17._30_2_ = sVar41;
            ptr_01 = b_01;
            ptr_02 = b_00;
            auVar20 = local_f8;
            auVar18 = local_f8;
            do {
              lVar29 = (long)(int)(ppVar3->mapper[(byte)s2[uVar40]] * uVar39) * 0x20;
              alVar1 = b_06[uVar22];
              auVar21 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
              auVar53 = vpalignr_avx2((undefined1  [32])alVar1,auVar21,0xe);
              alVar1 = b_05[uVar22];
              auVar21 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
              auVar51 = vpalignr_avx2((undefined1  [32])alVar1,auVar21,0xe);
              alVar1 = b_04[uVar22];
              auVar21 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
              auVar52 = vpalignr_avx2((undefined1  [32])alVar1,auVar21,0xe);
              alVar1 = b_03[uVar22];
              auVar21 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
              auVar21 = vpalignr_avx2((undefined1  [32])alVar1,auVar21,0xe);
              lVar37 = 0;
              local_2a8 = ZEXT1632(ZEXT816(0));
              local_138 = ZEXT1632(ZEXT816(0));
              auVar58 = ZEXT1664((undefined1  [16])0x0);
              auVar16._2_2_ = uVar44;
              auVar16._0_2_ = uVar44;
              auVar16._4_2_ = uVar44;
              auVar16._6_2_ = uVar44;
              auVar16._8_2_ = uVar44;
              auVar16._10_2_ = uVar44;
              auVar16._12_2_ = uVar44;
              auVar16._14_2_ = uVar44;
              auVar16._16_2_ = uVar44;
              auVar16._18_2_ = uVar44;
              auVar16._20_2_ = uVar44;
              auVar16._22_2_ = uVar44;
              auVar16._24_2_ = uVar44;
              auVar16._26_2_ = uVar44;
              auVar16._28_2_ = uVar44;
              auVar16._30_2_ = uVar44;
              auVar59 = ZEXT1664((undefined1  [16])0x0);
              do {
                auVar6 = vpaddsw_avx2(auVar21,*(undefined1 (*) [32])((long)pvVar2 + lVar37 + lVar29)
                                     );
                auVar7 = vpaddsw_avx2(auVar52,*(undefined1 (*) [32])((long)pvVar4 + lVar37 + lVar29)
                                     );
                auVar21 = *(undefined1 (*) [32])((long)*b_03 + lVar37);
                auVar52 = *(undefined1 (*) [32])((long)*b_04 + lVar37);
                auVar8 = vpaddsw_avx2(auVar51,*(undefined1 (*) [32])((long)pvVar5 + lVar37 + lVar29)
                                     );
                auVar51 = *(undefined1 (*) [32])((long)*b_05 + lVar37);
                auVar9 = vpaddsw_avx2(auVar59._0_32_,*(undefined1 (*) [32])((long)*ptr + lVar37));
                auVar10._8_2_ = 1;
                auVar10._0_8_ = 0x1000100010001;
                auVar10._10_2_ = 1;
                auVar10._12_2_ = 1;
                auVar10._14_2_ = 1;
                auVar10._16_2_ = 1;
                auVar10._18_2_ = 1;
                auVar10._20_2_ = 1;
                auVar10._22_2_ = 1;
                auVar10._24_2_ = 1;
                auVar10._26_2_ = 1;
                auVar10._28_2_ = 1;
                auVar10._30_2_ = 1;
                auVar10 = vpaddsw_avx2(auVar53,auVar10);
                auVar53 = *(undefined1 (*) [32])((long)*b_06 + lVar37);
                auVar13 = vpcmpgtw_avx2(auVar9,auVar16);
                auVar12 = vpblendvb_avx2(auVar58._0_32_,local_58,auVar13);
                auVar58 = ZEXT3264(auVar12);
                local_138 = vpblendvb_avx2(local_138,local_288,auVar13);
                auVar11 = vpaddsw_avx2(local_d8,*(undefined1 (*) [32])((long)*ptr_00 + lVar37));
                local_2a8 = vpblendvb_avx2(local_2a8,auVar11,auVar13);
                auVar13._2_2_ = uVar42;
                auVar13._0_2_ = uVar42;
                auVar13._4_2_ = uVar42;
                auVar13._6_2_ = uVar42;
                auVar13._8_2_ = uVar42;
                auVar13._10_2_ = uVar42;
                auVar13._12_2_ = uVar42;
                auVar13._14_2_ = uVar42;
                auVar13._16_2_ = uVar42;
                auVar13._18_2_ = uVar42;
                auVar13._20_2_ = uVar42;
                auVar13._22_2_ = uVar42;
                auVar13._24_2_ = uVar42;
                auVar13._26_2_ = uVar42;
                auVar13._28_2_ = uVar42;
                auVar13._30_2_ = uVar42;
                auVar13 = vpsubsw_avx2(auVar21,auVar13);
                auVar11._2_2_ = uVar43;
                auVar11._0_2_ = uVar43;
                auVar11._4_2_ = uVar43;
                auVar11._6_2_ = uVar43;
                auVar11._8_2_ = uVar43;
                auVar11._10_2_ = uVar43;
                auVar11._12_2_ = uVar43;
                auVar11._14_2_ = uVar43;
                auVar11._16_2_ = uVar43;
                auVar11._18_2_ = uVar43;
                auVar11._20_2_ = uVar43;
                auVar11._22_2_ = uVar43;
                auVar11._24_2_ = uVar43;
                auVar11._26_2_ = uVar43;
                auVar11._28_2_ = uVar43;
                auVar11._30_2_ = uVar43;
                auVar19 = vpsubsw_avx2(*(undefined1 (*) [32])((long)*b + lVar37),auVar11);
                auVar11 = vpcmpgtw_avx2(auVar13,auVar19);
                auVar15 = vpmaxsw_avx2(auVar13,auVar19);
                auVar13 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_00 + lVar37),auVar52,
                                         auVar11);
                auVar19 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_01 + lVar37),auVar51,
                                         auVar11);
                auVar11 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_02 + lVar37),auVar53,
                                         auVar11);
                auVar14._8_2_ = 1;
                auVar14._0_8_ = 0x1000100010001;
                auVar14._10_2_ = 1;
                auVar14._12_2_ = 1;
                auVar14._14_2_ = 1;
                auVar14._16_2_ = 1;
                auVar14._18_2_ = 1;
                auVar14._20_2_ = 1;
                auVar14._22_2_ = 1;
                auVar14._24_2_ = 1;
                auVar14._26_2_ = 1;
                auVar14._28_2_ = 1;
                auVar14._30_2_ = 1;
                auVar11 = vpaddsw_avx2(auVar11,auVar14);
                auVar14 = vpcmpgtw_avx2(auVar15,auVar6);
                *(undefined1 (*) [32])((long)*b + lVar37) = auVar15;
                *(undefined1 (*) [32])((long)*b_00 + lVar37) = auVar13;
                local_58 = vpblendvb_avx2(auVar7,auVar13,auVar14);
                *(undefined1 (*) [32])((long)*b_01 + lVar37) = auVar19;
                local_288 = vpblendvb_avx2(auVar8,auVar19,auVar14);
                local_d8 = vpblendvb_avx2(auVar10,auVar11,auVar14);
                *(undefined1 (*) [32])((long)*b_02 + lVar37) = auVar11;
                auVar16 = vpmaxsw_avx2(auVar16,auVar9);
                auVar9 = vpmaxsw_avx2(auVar15,auVar6);
                auVar59 = ZEXT3264(auVar9);
                *(undefined1 (*) [32])((long)*b_03 + lVar37) = auVar6;
                *(undefined1 (*) [32])((long)*b_04 + lVar37) = auVar7;
                *(undefined1 (*) [32])((long)*b_05 + lVar37) = auVar8;
                *(undefined1 (*) [32])((long)*b_06 + lVar37) = auVar10;
                lVar37 = lVar37 + 0x20;
              } while (lVar28 != lVar37);
              auVar21 = vperm2i128_avx2(local_58,local_58,0x28);
              local_58 = vpalignr_avx2(local_58,auVar21,0xe);
              auVar21 = vperm2i128_avx2(local_288,local_288,0x28);
              local_288 = vpalignr_avx2(local_288,auVar21,0xe);
              auVar52 = vperm2i128_avx2(local_d8,local_d8,0x28);
              auVar21 = vperm2i128_avx2(auVar9,auVar9,0x28);
              auVar51 = vpalignr_avx2(auVar9,auVar21,0xe);
              auVar21 = vpaddsw_avx2(auVar51,(undefined1  [32])*ptr);
              local_d8 = vpalignr_avx2(local_d8,auVar52,0xe);
              auVar7 = vpcmpgtw_avx2(auVar16,auVar21);
              auVar53 = vpblendvb_avx2(local_58,auVar12,auVar7);
              auVar6 = vpblendvb_avx2(local_288,local_138,auVar7);
              auVar52 = vpaddsw_avx2(local_d8,(undefined1  [32])*ptr_00);
              auVar16 = vpmaxsw_avx2(auVar16,auVar21);
              auVar21 = vpblendvb_avx2(auVar52,local_2a8,auVar7);
              iVar27 = 0xe;
              do {
                auVar8 = vperm2i128_avx2(auVar21,auVar21,0x28);
                auVar9 = vperm2i128_avx2(auVar6,auVar6,0x28);
                auVar10 = vperm2i128_avx2(auVar53,auVar53,0x28);
                auVar52 = vperm2i128_avx2(auVar16,auVar16,0x28);
                auVar52 = vpalignr_avx2(auVar16,auVar52,0xe);
                auVar52 = vpaddsw_avx2(auVar52,auVar46);
                auVar7 = vpcmpgtw_avx2(auVar16,auVar52);
                auVar16 = vpmaxsw_avx2(auVar52,auVar16);
                auVar52 = vpalignr_avx2(auVar53,auVar10,0xe);
                auVar53 = vpblendvb_avx2(auVar52,auVar53,auVar7);
                auVar52 = vpalignr_avx2(auVar6,auVar9,0xe);
                auVar6 = vpblendvb_avx2(auVar52,auVar6,auVar7);
                auVar52 = vpalignr_avx2(auVar21,auVar8,0xe);
                auVar52 = vpaddsw_avx2(auVar50,auVar52);
                auVar21 = vpblendvb_avx2(auVar52,auVar21,auVar7);
                iVar27 = iVar27 + -1;
              } while (iVar27 != 0);
              auVar52 = vperm2i128_avx2(auVar16,auVar16,0x28);
              auVar52 = vpalignr_avx2(auVar16,auVar52,0xe);
              auVar52 = vpaddsw_avx2(auVar52,ZEXT432(uVar36));
              auVar9 = vpcmpgtw_avx2(auVar52,auVar51);
              auVar16 = vperm2i128_avx2(auVar21,auVar21,0x28);
              auVar21 = vpalignr_avx2(auVar21,auVar16,0xe);
              auVar8 = vpblendvb_avx2(local_d8,auVar21,auVar9);
              auVar16 = vperm2i128_avx2(auVar6,auVar6,0x28);
              auVar16 = vpalignr_avx2(auVar6,auVar16,0xe);
              auVar7 = vpblendvb_avx2(local_288,auVar16,auVar9);
              auVar6 = vperm2i128_avx2(auVar53,auVar53,0x28);
              auVar53 = vpalignr_avx2(auVar53,auVar6,0xe);
              auVar6 = vpblendvb_avx2(local_58,auVar53,auVar9);
              auVar51 = vpmaxsw_avx2(auVar52,auVar51);
              lVar29 = 0;
              auVar12._2_2_ = uVar42;
              auVar12._0_2_ = uVar42;
              auVar12._4_2_ = uVar42;
              auVar12._6_2_ = uVar42;
              auVar12._8_2_ = uVar42;
              auVar12._10_2_ = uVar42;
              auVar12._12_2_ = uVar42;
              auVar12._14_2_ = uVar42;
              auVar12._16_2_ = uVar42;
              auVar12._18_2_ = uVar42;
              auVar12._20_2_ = uVar42;
              auVar12._22_2_ = uVar42;
              auVar12._24_2_ = uVar42;
              auVar12._26_2_ = uVar42;
              auVar12._28_2_ = uVar42;
              auVar12._30_2_ = uVar42;
              auVar9._2_2_ = uVar43;
              auVar9._0_2_ = uVar43;
              auVar9._4_2_ = uVar43;
              auVar9._6_2_ = uVar43;
              auVar9._8_2_ = uVar43;
              auVar9._10_2_ = uVar43;
              auVar9._12_2_ = uVar43;
              auVar9._14_2_ = uVar43;
              auVar9._16_2_ = uVar43;
              auVar9._18_2_ = uVar43;
              auVar9._20_2_ = uVar43;
              auVar9._22_2_ = uVar43;
              auVar9._24_2_ = uVar43;
              auVar9._26_2_ = uVar43;
              auVar9._28_2_ = uVar43;
              auVar9._30_2_ = uVar43;
              do {
                auVar10 = *(undefined1 (*) [32])((long)*b_03 + lVar29);
                auVar51 = vpsubsw_avx2(auVar51,auVar12);
                auVar11 = vpsubsw_avx2(auVar52,auVar9);
                auVar52 = vpmaxsw_avx2(auVar11,auVar51);
                auVar51 = vpcmpgtw_avx2(auVar51,auVar11);
                auVar53 = vpblendvb_avx2(auVar53,auVar6,auVar51);
                auVar16 = vpblendvb_avx2(auVar16,auVar7,auVar51);
                auVar21 = vpblendvb_avx2(auVar21,auVar8,auVar51);
                auVar19._8_2_ = 1;
                auVar19._0_8_ = 0x1000100010001;
                auVar19._10_2_ = 1;
                auVar19._12_2_ = 1;
                auVar19._14_2_ = 1;
                auVar19._16_2_ = 1;
                auVar19._18_2_ = 1;
                auVar19._20_2_ = 1;
                auVar19._22_2_ = 1;
                auVar19._24_2_ = 1;
                auVar19._26_2_ = 1;
                auVar19._28_2_ = 1;
                auVar19._30_2_ = 1;
                auVar21 = vpaddsw_avx2(auVar19,auVar21);
                auVar51 = vpmaxsw_avx2(auVar10,*(undefined1 (*) [32])((long)*b + lVar29));
                auVar11 = vpmaxsw_avx2(auVar51,auVar52);
                auVar51 = vpmaxsw_avx2(auVar11,_DAT_00908c40);
                auVar8 = vpcmpeqw_avx2(auVar51,auVar52);
                auVar6 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_00 + lVar29),auVar53,auVar8)
                ;
                auVar7 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_01 + lVar29),auVar16,auVar8)
                ;
                auVar8 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_02 + lVar29),auVar21,auVar8)
                ;
                auVar10 = vpcmpeqw_avx2(auVar10,auVar51);
                auVar6 = vpblendvb_avx2(auVar6,*(undefined1 (*) [32])((long)*b_04 + lVar29),auVar10)
                ;
                auVar7 = vpblendvb_avx2(auVar7,*(undefined1 (*) [32])((long)*b_05 + lVar29),auVar10)
                ;
                auVar8 = vpblendvb_avx2(auVar8,*(undefined1 (*) [32])((long)*b_06 + lVar29),auVar10)
                ;
                auVar10 = vpcmpgtw_avx2(auVar19,auVar11);
                auVar6 = vpandn_avx2(auVar10,auVar6);
                auVar7 = vpandn_avx2(auVar10,auVar7);
                auVar8 = vpandn_avx2(auVar10,auVar8);
                auVar18 = vpmaxsw_avx2(auVar18,auVar51);
                auVar18 = vpmaxsw_avx2(auVar18,auVar6);
                auVar10 = vpmaxsw_avx2(auVar7,auVar8);
                auVar18 = vpmaxsw_avx2(auVar18,auVar10);
                *(undefined1 (*) [32])((long)*b_03 + lVar29) = auVar51;
                *(undefined1 (*) [32])((long)*b_04 + lVar29) = auVar6;
                *(undefined1 (*) [32])((long)*b_05 + lVar29) = auVar7;
                *(undefined1 (*) [32])((long)*b_06 + lVar29) = auVar8;
                auVar17 = vpminsw_avx2(auVar17,auVar51);
                auVar20 = vpmaxsw_avx2(auVar20,auVar51);
                lVar29 = lVar29 + 0x20;
              } while (lVar28 != lVar29);
              auVar21 = vpcmpgtw_avx2(auVar20,local_f8);
              if ((((((((((((((((((((((((((((((((auVar21 >> 7 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0 ||
                                               (auVar21 >> 0xf & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar21 >> 0x17 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar21 >> 0x1f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar21 >> 0x27 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar21 >> 0x2f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar21 >> 0x37 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar21 >> 0x3f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar21 >> 0x47 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar21 >> 0x4f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar21 >> 0x57 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar21 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar21 >> 0x67 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar21 >> 0x6f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar21 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar21 >> 0x7f,0) != '\0') ||
                                (auVar21 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar21 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar21 >> 0x97 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar21 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar21 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar21 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar21 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar21 >> 0xbf,0) != '\0') ||
                        (auVar21 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar21 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar21 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar21 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar21 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar21 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar21 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  auVar21[0x1f] < '\0') {
                auVar21 = vpermq_avx2(auVar20,0x44);
                auVar21 = vpmaxsw_avx2(auVar20,auVar21);
                auVar52 = vpslldq_avx2(auVar21,8);
                auVar21 = vpmaxsw_avx2(auVar21,auVar52);
                auVar52 = vpslldq_avx2(auVar21,4);
                auVar21 = vpmaxsw_avx2(auVar21,auVar52);
                auVar52 = vpslldq_avx2(auVar21,2);
                auVar21 = vpmaxsw_avx2(auVar21,auVar52);
                uVar23 = vpextrw_avx(auVar21._16_16_,7);
                uVar60 = (ushort)uVar23;
                auVar21 = vpshufhw_avx2(auVar21,0xff);
                auVar53._8_4_ = 6;
                auVar53._0_8_ = 0x600000006;
                auVar53._12_4_ = 6;
                auVar53._16_4_ = 6;
                auVar53._20_4_ = 6;
                auVar53._24_4_ = 6;
                auVar53._28_4_ = 6;
                local_f8 = vpermd_avx2(auVar53,auVar21);
                memcpy(__dest,b_03,__n);
                memcpy(__dest_00,b_04,__n);
                memcpy(__dest_01,b_05,__n);
                b_01 = ptr_01;
                b_00 = ptr_02;
                memcpy(__dest_02,b_06,__n);
                uVar35 = (uint)uVar60;
                local_2fc = (int)uVar40;
                ptr_01 = b_01;
                ptr_02 = b_00;
              }
              uVar40 = uVar40 + 1;
            } while (uVar40 != (uint)s2Len);
            if ((uVar24 + 0xf & 0x7ffffff0) == 0) {
              sVar26 = 0;
              sVar34 = 0;
              sVar30 = 0;
            }
            else {
              uVar40 = 0;
              sVar30 = 0;
              sVar34 = 0;
              sVar26 = 0;
              do {
                if ((*(short *)((long)*__dest + uVar40 * 2) == (short)uVar35) &&
                   (uVar38 = ((uint)uVar40 & 0xf) * uVar39 + ((uint)(uVar40 >> 4) & 0xfffffff),
                   (int)uVar38 < (int)uVar24)) {
                  sVar26 = *(short *)((long)*__dest_00 + uVar40 * 2);
                  sVar34 = *(short *)((long)*__dest_01 + uVar40 * 2);
                  sVar30 = *(short *)((long)*__dest_02 + uVar40 * 2);
                  uVar24 = (ulong)uVar38;
                }
                uVar38 = (uint)uVar24;
                uVar40 = uVar40 + 1;
              } while ((uVar39 & 0x7ffffff) << 4 != (int)uVar40);
            }
            auVar20._2_2_ = uVar44;
            auVar20._0_2_ = uVar44;
            auVar20._4_2_ = uVar44;
            auVar20._6_2_ = uVar44;
            auVar20._8_2_ = uVar44;
            auVar20._10_2_ = uVar44;
            auVar20._12_2_ = uVar44;
            auVar20._14_2_ = uVar44;
            auVar20._16_2_ = uVar44;
            auVar20._18_2_ = uVar44;
            auVar20._20_2_ = uVar44;
            auVar20._22_2_ = uVar44;
            auVar20._24_2_ = uVar44;
            auVar20._26_2_ = uVar44;
            auVar20._28_2_ = uVar44;
            auVar20._30_2_ = uVar44;
            auVar46 = vpcmpgtw_avx2(auVar20,auVar17);
            auVar6._2_2_ = sVar41;
            auVar6._0_2_ = sVar41;
            auVar6._4_2_ = sVar41;
            auVar6._6_2_ = sVar41;
            auVar6._8_2_ = sVar41;
            auVar6._10_2_ = sVar41;
            auVar6._12_2_ = sVar41;
            auVar6._14_2_ = sVar41;
            auVar6._16_2_ = sVar41;
            auVar6._18_2_ = sVar41;
            auVar6._20_2_ = sVar41;
            auVar6._22_2_ = sVar41;
            auVar6._24_2_ = sVar41;
            auVar6._26_2_ = sVar41;
            auVar6._28_2_ = sVar41;
            auVar6._30_2_ = sVar41;
            auVar50 = vpcmpgtw_avx2(auVar18,auVar6);
            auVar46 = vpor_avx2(auVar50,auVar46);
            if ((((((((((((((((((((((((((((((((auVar46 >> 7 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0 ||
                                             (auVar46 >> 0xf & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar46 >> 0x17 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar46 >> 0x1f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar46 >> 0x27 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar46 >> 0x2f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar46 >> 0x37 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar46 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar46 >> 0x47 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar46 >> 0x4f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar46 >> 0x57 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar46 >> 0x5f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar46 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar46 >> 0x6f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar46 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar46 >> 0x7f,0) != '\0') ||
                              (auVar46 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                             (auVar46 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar46 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar46 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar46 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar46 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar46 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar46 >> 0xbf,0) != '\0') ||
                      (auVar46 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar46 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar46 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar46 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar46 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar46 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar46 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                auVar46[0x1f] < '\0') {
              *(byte *)&ppVar25->flag = (byte)ppVar25->flag | 0x40;
              uVar35 = 0;
              sVar26 = 0;
              sVar34 = 0;
              sVar30 = 0;
              local_2fc = 0;
              uVar38 = 0;
            }
            ppVar25->score = (int)(short)uVar35;
            ppVar25->end_query = uVar38;
            ppVar25->end_ref = local_2fc;
            *(int *)(ppVar25->field_4).extra = (int)sVar26;
            ((ppVar25->field_4).stats)->similar = (int)sVar34;
            ((ppVar25->field_4).stats)->length = (int)sVar30;
            parasail_free(ptr_00);
            parasail_free(ptr);
            parasail_free(__dest_02);
            parasail_free(__dest_01);
            parasail_free(__dest_00);
            parasail_free(__dest);
            parasail_free(b_06);
            parasail_free(b_05);
            parasail_free(b_04);
            parasail_free(b_03);
            parasail_free(b_02);
            parasail_free(ptr_01);
            parasail_free(ptr_02);
            parasail_free(b);
            return ppVar25;
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvPm = NULL;
    __m256i* restrict pvPs = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHM = NULL;
    __m256i* restrict pvHS = NULL;
    __m256i* restrict pvHL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i* restrict pvGapperL = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxM;
    __m256i vMaxS;
    __m256i vMaxL;
    __m256i vMaxHUnit;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    __m256i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP  = (__m256i*)profile->profile16.score;
    pvPm = (__m256i*)profile->profile16.matches;
    pvPs = (__m256i*)profile->profile16.similar;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vMaxHUnit = vNegLimit;
    vSegLen = _mm256_slli_si256_rpl(_mm256_set1_epi16(segLen), 2);
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi16_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_adds_epi16(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m256i(32, segLen);
    pvEM = parasail_memalign___m256i(32, segLen);
    pvES = parasail_memalign___m256i(32, segLen);
    pvEL = parasail_memalign___m256i(32, segLen);
    pvH  = parasail_memalign___m256i(32, segLen);
    pvHM = parasail_memalign___m256i(32, segLen);
    pvHS = parasail_memalign___m256i(32, segLen);
    pvHL = parasail_memalign___m256i(32, segLen);
    pvHMax  = parasail_memalign___m256i(32, segLen);
    pvHMMax = parasail_memalign___m256i(32, segLen);
    pvHSMax = parasail_memalign___m256i(32, segLen);
    pvHLMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);
    pvGapperL = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;

    parasail_memset___m256i(pvH, vZero, segLen);
    parasail_memset___m256i(pvHM, vZero, segLen);
    parasail_memset___m256i(pvHS, vZero, segLen);
    parasail_memset___m256i(pvHL, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vZero, segLen);
    {
        __m256i vGapper = _mm256_subs_epi16(vZero,vGapO);
        __m256i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            _mm256_store_si256(pvGapperL+i, vGapperL);
            vGapper = _mm256_subs_epi16(vGapper, vGapE);
            vGapperL = _mm256_adds_epi16(vGapperL, vOne);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vHt;
        __m256i vHtM;
        __m256i vHtS;
        __m256i vHtL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        __m256i vHp;
        __m256i vHpM;
        __m256i vHpS;
        __m256i vHpL;
        __m256i *pvW;
        __m256i vW;
        __m256i *pvWM;
        __m256i vWM;
        __m256i *pvWS;
        __m256i vWS;
        __m256i case1;
        __m256i case2;
        __m256i case0;
        __m256i vGapper;
        __m256i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHpM = _mm256_load_si256(pvHM+(segLen-1));
        vHpS = _mm256_load_si256(pvHS+(segLen-1));
        vHpL = _mm256_load_si256(pvHL+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 2);
        vHpM = _mm256_slli_si256_rpl(vHpM, 2);
        vHpS = _mm256_slli_si256_rpl(vHpS, 2);
        vHpL = _mm256_slli_si256_rpl(vHpL, 2);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vHM= _mm256_load_si256(pvHM+i);
            vHS= _mm256_load_si256(pvHS+i);
            vHL= _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM= _mm256_load_si256(pvEM+i);
            vES= _mm256_load_si256(pvES+i);
            vEL= _mm256_load_si256(pvEL+i);
            vW = _mm256_load_si256(pvW+i);
            vWM = _mm256_load_si256(pvWM+i);
            vWS = _mm256_load_si256(pvWS+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vGapperL = _mm256_load_si256(pvGapperL+i);
            vE_opn = _mm256_subs_epi16(vH, vGapO);
            vE_ext = _mm256_subs_epi16(vE, vGapE);
            case1 = _mm256_cmpgt_epi16(vE_opn, vE_ext);
            vE = _mm256_max_epi16(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(vEL, vHL, case1);
            vEL = _mm256_adds_epi16(vEL, vOne);
            vGapper = _mm256_adds_epi16(vHt, vGapper);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi16(vF, vGapper),
                    _mm256_cmpeq_epi16(vF, vGapper));
            vF = _mm256_max_epi16(vF, vGapper);
            vFM = _mm256_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm256_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_adds_epi16(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm256_adds_epi16(vHp, vW);
            vHpM = _mm256_adds_epi16(vHpM, vWM);
            vHpS = _mm256_adds_epi16(vHpS, vWS);
            vHpL = _mm256_adds_epi16(vHpL, vOne);
            case1 = _mm256_cmpgt_epi16(vE, vHp);
            vHt = _mm256_max_epi16(vE, vHp);
            vHtM = _mm256_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm256_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm256_blendv_epi8(vHpL, vEL, case1);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvEM+i, vEM);
            _mm256_store_si256(pvES+i, vES);
            _mm256_store_si256(pvEL+i, vEL);
            _mm256_store_si256(pvH+i, vHp);
            _mm256_store_si256(pvHM+i, vHpM);
            _mm256_store_si256(pvHS+i, vHpS);
            _mm256_store_si256(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 2);
        vHtM = _mm256_slli_si256_rpl(vHtM, 2);
        vHtS = _mm256_slli_si256_rpl(vHtS, 2);
        vHtL = _mm256_slli_si256_rpl(vHtL, 2);
        vGapper = _mm256_load_si256(pvGapper);
        vGapperL = _mm256_load_si256(pvGapperL);
        vGapper = _mm256_adds_epi16(vHt, vGapper);
        case1 = _mm256_or_si256(
                _mm256_cmpgt_epi16(vGapper, vF),
                _mm256_cmpeq_epi16(vGapper, vF));
        vF = _mm256_max_epi16(vF, vGapper);
        vFM = _mm256_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm256_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm256_blendv_epi8(
                vFL,
                _mm256_adds_epi16(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 2);
            __m256i vFtM = _mm256_slli_si256_rpl(vFM, 2);
            __m256i vFtS = _mm256_slli_si256_rpl(vFS, 2);
            __m256i vFtL = _mm256_slli_si256_rpl(vFL, 2);
            vFt = _mm256_adds_epi16(vFt, vSegLenXgap);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi16(vFt, vF),
                    _mm256_cmpeq_epi16(vFt, vF));
            vF = _mm256_max_epi16(vF, vFt);
            vFM = _mm256_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm256_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm256_blendv_epi8(
                    vFL,
                    _mm256_adds_epi16(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 2);
        vFM = _mm256_slli_si256_rpl(vFM, 2);
        vFS = _mm256_slli_si256_rpl(vFS, 2);
        vFL = _mm256_slli_si256_rpl(vFL, 2);
        vF = _mm256_adds_epi16(vF, vNegInfFront);
        case1 = _mm256_cmpgt_epi16(vF, vHt);
        vH = _mm256_max_epi16(vF, vHt);
        vHM = _mm256_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm256_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm256_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm256_load_si256(pvH+i);
            vHpM = _mm256_load_si256(pvHM+i);
            vHpS = _mm256_load_si256(pvHS+i);
            vHpL = _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM = _mm256_load_si256(pvEM+i);
            vES = _mm256_load_si256(pvES+i);
            vEL = _mm256_load_si256(pvEL+i);
            vF_opn = _mm256_subs_epi16(vH, vGapO);
            vF_ext = _mm256_subs_epi16(vF, vGapE);
            vF = _mm256_max_epi16(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(vFL, vHL, case1);
            vFL = _mm256_adds_epi16(vFL, vOne);
            vH = _mm256_max_epi16(vHp, vE);
            vH = _mm256_max_epi16(vH, vF);
            vH = _mm256_max_epi16(vH, vZero);
            case1 = _mm256_cmpeq_epi16(vH, vHp);
            case2 = _mm256_cmpeq_epi16(vH, vF);
            case0 = _mm256_cmpeq_epi16(vH, vZero);
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHM = _mm256_blendv_epi8(vHM, vZero, case0);
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHS = _mm256_blendv_epi8(vHS, vZero, case0);
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            vHL = _mm256_blendv_epi8(vHL, vZero, case0);
            _mm256_store_si256(pvH+i, vH);
            _mm256_store_si256(pvHM+i, vHM);
            _mm256_store_si256(pvHS+i, vHS);
            _mm256_store_si256(pvHL+i, vHL);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
            {
                __m256i cond_max = _mm256_cmpgt_epi16(vH, vMaxH);
                vMaxH = _mm256_max_epi16(vH, vMaxH);
                vMaxM = _mm256_blendv_epi8(vMaxM, vHM, cond_max);
                vMaxS = _mm256_blendv_epi8(vMaxS, vHS, cond_max);
                vMaxL = _mm256_blendv_epi8(vMaxL, vHL, cond_max);
            }
        } 

        {
            __m256i vCompare = _mm256_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi16_rpl(vMaxH);
                vMaxHUnit = _mm256_set1_epi16(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m256i)*segLen);
                (void)memcpy(pvHMMax, pvHM, sizeof(__m256i)*segLen);
                (void)memcpy(pvHSMax, pvHS, sizeof(__m256i)*segLen);
                (void)memcpy(pvHLMax, pvHL, sizeof(__m256i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m256i vH = _mm256_load_si256(pvH + offset);
            __m256i vHM = _mm256_load_si256(pvHM + offset);
            __m256i vHS = _mm256_load_si256(pvHS + offset);
            __m256i vHL = _mm256_load_si256(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
                vHM = _mm256_slli_si256_rpl(vHM, 2);
                vHS = _mm256_slli_si256_rpl(vHS, 2);
                vHL = _mm256_slli_si256_rpl(vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHM, 15);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHS, 15);
            result->stats->rowcols->length_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHL, 15);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int16_t *t = (int16_t*)pvHMax;
        int16_t *m = (int16_t*)pvHMMax;
        int16_t *s = (int16_t*)pvHSMax;
        int16_t *l = (int16_t*)pvHLMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                    matches = *m;
                    similar = *s;
                    length = *l;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        __m256i vHM = _mm256_load_si256(pvHM+i);
        __m256i vHS = _mm256_load_si256(pvHS+i);
        __m256i vHL = _mm256_load_si256(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}